

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O3

sc_context_t sc_context_create(void *stack_ptr,size_t stack_size,sc_context_proc_t proc)

{
  void *pvVar1;
  long lVar2;
  context_data *pcVar3;
  sc_context_sp_t pvVar4;
  ulong uVar5;
  sc_context_t psVar6;
  
  if (stack_ptr == (void *)0x0) {
    __assert_fail("stack_ptr != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",0x40,
                  "sc_context_t sc_context_create(void *, size_t, sc_context_proc_t)");
  }
  if (stack_size < 0x800) {
    __assert_fail("stack_size >= SC_MIN_STACK_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",0x41,
                  "sc_context_t sc_context_create(void *, size_t, sc_context_proc_t)");
  }
  if (proc == (sc_context_proc_t)0x0) {
    __assert_fail("proc != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",0x42,
                  "sc_context_t sc_context_create(void *, size_t, sc_context_proc_t)");
  }
  uVar5 = stack_size + (long)stack_ptr & 0xfffffffffffffff8;
  psVar6 = (sc_context_t)(uVar5 - 0x20);
  if (stack_ptr < psVar6) {
    pvVar1 = (void *)((ulong)psVar6 & 0xffffffffffffffc0);
    if (pvVar1 < stack_ptr || (long)pvVar1 - (long)stack_ptr == 0) {
      __assert_fail("sp_addr > stack_addr",
                    "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",0x50,
                    "sc_context_t sc_context_create(void *, size_t, sc_context_proc_t)");
    }
    lVar2 = sc_make_context(pvVar1,(long)pvVar1 - (long)stack_ptr,context_proc);
    if (lVar2 != 0) {
      *(sc_context_proc_t *)(uVar5 - 0x18) = proc;
      pcVar3 = sc_get_curr_context_data();
      if (pcVar3 == (context_data *)0x0) {
        pcVar3 = sc_get_main_context_data();
      }
      *(context_data **)(uVar5 - 0x10) = pcVar3;
      *(undefined8 *)(uVar5 - 8) = 0;
      pvVar4 = (sc_context_sp_t)sc_jump_context(lVar2,psVar6);
      psVar6->ctx = pvVar4;
      return psVar6;
    }
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",0x57,
                  "sc_context_t sc_context_create(void *, size_t, sc_context_proc_t)");
  }
  __assert_fail("data_addr > stack_addr",
                "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",0x4b,
                "sc_context_t sc_context_create(void *, size_t, sc_context_proc_t)");
}

Assistant:

sc_context_t SC_CALL_DECL sc_context_create (
    void* stack_ptr,
    size_t stack_size,
    sc_context_proc_t proc
) {
    uintptr_t stack_addr;
    uintptr_t sp_addr;
    uintptr_t data_addr;
    sc_context_sp_t ctx;
    context_data* data;

    assert(stack_ptr != NULL);
    assert(stack_size >= SC_MIN_STACK_SIZE);
    assert(proc != NULL);

    /* Determine the bottom of the stack */
    stack_addr = (uintptr_t)stack_ptr;
    sp_addr = stack_addr + stack_size;

    /* Reserve some space at the bottom for the context data */
    data_addr = sp_addr - sizeof(context_data);
    data_addr = align_down(data_addr, ALIGNOF(context_data));
    assert(data_addr > stack_addr);
    sp_addr = data_addr;

    /* Align the stack pointer to a 64-byte boundary */
    sp_addr = align_down(sp_addr, 64);
    assert(sp_addr > stack_addr);

    /* Determine the new stack size */
    stack_size = sp_addr - stack_addr;

    /* Create the context */
    ctx = sc_make_context((void*)sp_addr, stack_size, context_proc);
    assert(ctx != NULL);

    /* Create the context data at the reserved address */
    data = (context_data*)data_addr;
    data->proc = proc;
    data->parent = sc_current_context();
    data->user_data = NULL;

    /* Transfer the proc pointer to the context by briefly switching to it */
    data->ctx = sc_jump_context(ctx, data).ctx;
    return data;
}